

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlschemas(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  FILE *__stream;
  xmlDocPtr pxVar17;
  undefined8 uVar18;
  size_t sVar19;
  xmlDocPtr pxVar20;
  xmlNodePtr val;
  xmlParserInputBufferPtr pxVar21;
  int nr;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  undefined4 *puVar25;
  int n_output;
  int iVar26;
  uint uVar27;
  undefined4 uVar28;
  xmlParserInputBufferPtr pxVar29;
  int test_ret_4;
  int test_ret_3;
  int iVar30;
  uint uVar31;
  char *__s;
  uint *puVar32;
  int test_ret;
  int iVar33;
  int *piVar34;
  undefined8 *puVar35;
  bool bVar36;
  int test_ret_2;
  int test_ret_7;
  int test_ret_6;
  int test_ret_1;
  uint local_4c;
  undefined8 *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlschemas : 16 of 27 functions ...");
  }
  iVar33 = 0;
  iVar26 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (iVar26 == 0) {
      __stream = fopen64("test.out","a+");
    }
    else {
      __stream = (FILE *)0x0;
    }
    xmlSchemaDump(__stream);
    call_tests = call_tests + 1;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaDump",(ulong)(uint)(iVar3 - iVar2));
      iVar33 = iVar33 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar26 = iVar26 + 1;
  } while (iVar26 == 1);
  function_tests = function_tests + 1;
  iVar26 = xmlMemBlocks();
  xmlSchemaGetParserErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar26 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetParserErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  local_4c = (uint)(iVar26 != iVar2);
  function_tests = function_tests + 1;
  iVar26 = xmlMemBlocks();
  uVar24 = 0;
  xmlSchemaGetValidErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar26 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetValidErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    uVar24 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlSchemaIsValid(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaIsValid");
    uVar24 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar27 = 0;
  iVar1 = 0;
  do {
    iVar5 = xmlMemBlocks();
    pxVar17 = gen_xmlDocPtr(uVar27,(int)uVar24);
    uVar18 = xmlSchemaNewDocParserCtxt(pxVar17);
    xmlSchemaFreeParserCtxt(uVar18);
    call_tests = call_tests + 1;
    if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
      xmlFreeDoc(pxVar17);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaNewDocParserCtxt",(ulong)(uint)(iVar6 - iVar5));
      iVar1 = iVar1 + 1;
      uVar24 = (ulong)uVar27;
      printf(" %d");
      putchar(10);
    }
    uVar27 = uVar27 + 1;
  } while (uVar27 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar27 = 0;
  do {
    piVar34 = &DAT_00163454;
    uVar24 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar27 == 0) {
        bVar36 = false;
        __s = "foo";
      }
      else if (uVar27 == 2) {
        bVar36 = false;
        __s = "test/ent2";
      }
      else if (uVar27 == 1) {
        bVar36 = false;
        __s = "<foo/>";
      }
      else {
        bVar36 = true;
        __s = (char *)0x0;
      }
      iVar7 = -1;
      if ((uint)uVar24 < 4) {
        iVar7 = *piVar34;
      }
      if (bVar36) {
LAB_00142644:
        uVar18 = xmlSchemaNewMemParserCtxt(__s,iVar7);
        xmlSchemaFreeParserCtxt(uVar18);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaNewMemParserCtxt",(ulong)(uint)(iVar7 - iVar6)
                );
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar27);
          printf(" %d",uVar24);
          putchar(10);
        }
      }
      else {
        sVar19 = strlen(__s);
        if (iVar7 <= (int)sVar19 + 1) goto LAB_00142644;
      }
      uVar22 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar22;
      piVar34 = piVar34 + 1;
    } while (uVar22 != 4);
    uVar27 = uVar27 + 1;
    if (uVar27 == 4) {
      function_tests = function_tests + 1;
      puVar35 = &DAT_00165d58;
      uVar27 = 0;
      iVar6 = 0;
      do {
        iVar7 = xmlMemBlocks();
        if (uVar27 < 3) {
          uVar18 = *puVar35;
        }
        else {
          uVar18 = 0;
        }
        xmlSchemaNewParserCtxt(uVar18);
        xmlSchemaFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaNewParserCtxt",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar27);
          putchar(10);
        }
        uVar27 = uVar27 + 1;
        puVar35 = puVar35 + 1;
      } while (uVar27 != 4);
      function_tests = function_tests + 1;
      iVar7 = xmlMemBlocks();
      xmlSchemaSAXUnplug(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaSAXUnplug",(ulong)(uint)(iVar9 - iVar7));
        printf(" %d",0);
        putchar(10);
      }
      function_tests = function_tests + 1;
      puVar32 = &DAT_00163454;
      uVar27 = 0;
      iVar9 = 0;
      do {
        iVar10 = xmlMemBlocks();
        pxVar17 = (xmlDocPtr)0xffffffff;
        if (uVar27 < 4) {
          pxVar17 = (xmlDocPtr)(ulong)*puVar32;
        }
        xmlSchemaSetValidOptions(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaSetValidOptions",
                 (ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",0);
          pxVar17 = (xmlDocPtr)(ulong)uVar27;
          printf(" %d");
          putchar(10);
        }
        uVar27 = uVar27 + 1;
        puVar32 = puVar32 + 1;
      } while (uVar27 != 4);
      function_tests = function_tests + 1;
      iVar10 = xmlMemBlocks();
      xmlSchemaValidCtxtGetOptions(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidCtxtGetOptions");
        pxVar17 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar12 = xmlMemBlocks();
      uVar18 = xmlSchemaValidCtxtGetParserCtxt(0);
      xmlFreeParserCtxt(uVar18);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidCtxtGetParserCtxt");
        pxVar17 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      uVar27 = 0;
      iVar30 = 0;
      do {
        iVar15 = (int)pxVar17;
        iVar14 = xmlMemBlocks();
        pxVar20 = gen_xmlDocPtr(uVar27,iVar15);
        pxVar17 = pxVar20;
        xmlSchemaValidateDoc(0);
        call_tests = call_tests + 1;
        if (((pxVar20 != (xmlDocPtr)0x0) && (api_doc != pxVar20)) && (pxVar20->doc != api_doc)) {
          xmlFreeDoc(pxVar20);
        }
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar14 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateDoc",(ulong)(uint)(iVar15 - iVar14));
          iVar30 = iVar30 + 1;
          printf(" %d",0);
          pxVar17 = (xmlDocPtr)(ulong)uVar27;
          printf(" %d");
          putchar(10);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != 4);
      function_tests = function_tests + 1;
      local_48 = &DAT_00165d90;
      iVar14 = 0;
      uVar27 = 0;
      do {
        puVar25 = &DAT_00163454;
        uVar22 = 0;
        do {
          iVar15 = xmlMemBlocks();
          if (uVar27 < 7) {
            val = (xmlNodePtr)(&DAT_00165d90)[uVar27];
          }
          else {
            val = (xmlNodePtr)0x0;
          }
          uVar28 = 0xffffffff;
          if (uVar22 < 4) {
            uVar28 = *puVar25;
          }
          xmlSchemaValidateFile(0,val,uVar28);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar16 = xmlMemBlocks();
          if (iVar15 != iVar16) {
            iVar16 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateFile",(ulong)(uint)(iVar16 - iVar15)
                  );
            iVar14 = iVar14 + 1;
            printf(" %d",0);
            printf(" %d",(ulong)uVar27);
            val = (xmlNodePtr)(ulong)uVar22;
            printf(" %d");
            putchar(10);
          }
          uVar22 = uVar22 + 1;
          puVar25 = puVar25 + 1;
        } while (uVar22 != 4);
        uVar27 = uVar27 + 1;
      } while (uVar27 != 8);
      local_38 = (uint)(iVar12 != iVar13);
      function_tests = function_tests + 1;
      uVar27 = 0;
      local_3c = 0;
      do {
        iVar13 = (int)val;
        iVar12 = xmlMemBlocks();
        val = gen_xmlNodePtr(uVar27,iVar13);
        xmlSchemaValidateOneElement(0,val);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar27,val,nr);
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateOneElement",
                 (ulong)(uint)(iVar13 - iVar12));
          local_3c = local_3c + 1;
          printf(" %d",0);
          val = (xmlNodePtr)(ulong)uVar27;
          printf(" %d");
          putchar(10);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != 3);
      function_tests = function_tests + 1;
      uVar27 = 0;
      local_40 = 0;
      do {
        iVar12 = xmlMemBlocks();
        if (uVar27 < 7) {
          pxVar29 = (xmlParserInputBufferPtr)*local_48;
        }
        else {
          pxVar29 = (xmlParserInputBufferPtr)0x0;
        }
        xmlSchemaValidateSetFilename(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateSetFilename",
                 (ulong)(uint)(iVar13 - iVar12));
          local_40 = local_40 + 1;
          printf(" %d",0);
          pxVar29 = (xmlParserInputBufferPtr)(ulong)uVar27;
          printf(" %d");
          putchar(10);
        }
        uVar27 = uVar27 + 1;
        local_48 = local_48 + 1;
      } while (uVar27 != 8);
      function_tests = function_tests + 1;
      iVar12 = 0;
      uVar27 = 0;
      do {
        uVar22 = 0;
        do {
          uVar31 = 0;
          do {
            uVar23 = 0;
            do {
              iVar15 = (int)pxVar29;
              iVar13 = xmlMemBlocks();
              pxVar21 = gen_xmlParserInputBufferPtr(uVar27,iVar15);
              uVar28 = 0xffffffff;
              if (uVar22 < 3) {
                uVar28 = (&DAT_00155228)[uVar22];
              }
              if (uVar31 == 0) {
                uVar18 = __xmlDefaultSAXHandler();
              }
              else {
                uVar18 = 0;
              }
              piVar34 = &call_tests;
              if (uVar23 != 0) {
                if (uVar23 == 1) {
                  piVar34 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar34 = (int *)0x0;
                }
              }
              pxVar29 = pxVar21;
              xmlSchemaValidateStream(0,pxVar21,uVar28,uVar18,piVar34);
              call_tests = call_tests + 1;
              xmlFreeParserInputBuffer(pxVar21);
              xmlResetLastError();
              iVar15 = xmlMemBlocks();
              if (iVar13 != iVar15) {
                iVar15 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateStream",
                       (ulong)(uint)(iVar15 - iVar13));
                iVar12 = iVar12 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar27);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar31);
                pxVar29 = (xmlParserInputBufferPtr)(ulong)uVar23;
                printf(" %d");
                putchar(10);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != 3);
            bVar36 = uVar31 == 0;
            uVar31 = uVar31 + 1;
          } while (bVar36);
          uVar22 = uVar22 + 1;
        } while (uVar22 != 4);
        uVar27 = uVar27 + 1;
      } while (uVar27 != 8);
      function_tests = function_tests + 1;
      uVar27 = local_4c + iVar33 + (uint)(iVar26 != iVar2) + (uint)(iVar3 != iVar4) + iVar1 +
               iVar5 + iVar6 + (uint)(iVar7 != iVar8) + iVar9 + (uint)(iVar10 != iVar11) + local_38
               + iVar30 + iVar14 + local_3c + local_40 + iVar12;
      if (uVar27 != 0) {
        printf("Module xmlschemas: %d errors\n",(ulong)uVar27);
      }
      return uVar27;
    }
  } while( true );
}

Assistant:

static int
test_xmlschemas(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemas : 16 of 27 functions ...\n");
    test_ret += test_xmlSchemaDump();
    test_ret += test_xmlSchemaGetParserErrors();
    test_ret += test_xmlSchemaGetValidErrors();
    test_ret += test_xmlSchemaIsValid();
    test_ret += test_xmlSchemaNewDocParserCtxt();
    test_ret += test_xmlSchemaNewMemParserCtxt();
    test_ret += test_xmlSchemaNewParserCtxt();
    test_ret += test_xmlSchemaNewValidCtxt();
    test_ret += test_xmlSchemaParse();
    test_ret += test_xmlSchemaSAXPlug();
    test_ret += test_xmlSchemaSAXUnplug();
    test_ret += test_xmlSchemaSetParserErrors();
    test_ret += test_xmlSchemaSetParserStructuredErrors();
    test_ret += test_xmlSchemaSetValidErrors();
    test_ret += test_xmlSchemaSetValidOptions();
    test_ret += test_xmlSchemaSetValidStructuredErrors();
    test_ret += test_xmlSchemaValidCtxtGetOptions();
    test_ret += test_xmlSchemaValidCtxtGetParserCtxt();
    test_ret += test_xmlSchemaValidateDoc();
    test_ret += test_xmlSchemaValidateFile();
    test_ret += test_xmlSchemaValidateOneElement();
    test_ret += test_xmlSchemaValidateSetFilename();
    test_ret += test_xmlSchemaValidateSetLocator();
    test_ret += test_xmlSchemaValidateStream();

    if (test_ret != 0)
	printf("Module xmlschemas: %d errors\n", test_ret);
    return(test_ret);
}